

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.h
# Opt level: O0

float SaturatedAdd<float>(float Min,float Max,float Current,float Modifier)

{
  float Modifier_local;
  float Current_local;
  float Max_local;
  float Min_local;
  undefined4 local_4;
  
  local_4 = Current;
  if (0.0 <= Modifier) {
    if (Current <= Max) {
      Current_local = Modifier + Current;
      if (Max < Current_local) {
        Current_local = Max;
      }
      local_4 = Current_local;
    }
  }
  else if (Min <= Current) {
    Current_local = Modifier + Current;
    if (Current_local < Min) {
      Current_local = Min;
    }
    local_4 = Current_local;
  }
  return local_4;
}

Assistant:

inline T SaturatedAdd(T Min, T Max, T Current, T Modifier)
{
	if(Modifier < 0)
	{
		if(Current < Min)
			return Current;
		Current += Modifier;
		if(Current < Min)
			Current = Min;
		return Current;
	}
	else
	{
		if(Current > Max)
			return Current;
		Current += Modifier;
		if(Current > Max)
			Current = Max;
		return Current;
	}
}